

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_event_loop.cpp
# Opt level: O0

bool __thiscall cppurses::detail::Timer_event_loop::loop_function(Timer_event_loop *this)

{
  bool bVar1;
  reference ppWVar2;
  rep rVar3;
  duration<long,_std::ratio<1L,_1000L>_> local_58;
  duration<long,_std::ratio<1L,_1000L>_> local_50;
  duration<long,_std::ratio<1L,_1000000000L>_> local_48;
  type time_to_sleep;
  type time_passed;
  time_point now;
  Widget *widg;
  iterator __end2;
  iterator __begin2;
  set<cppurses::Widget_*,_std::less<cppurses::Widget_*>,_std::allocator<cppurses::Widget_*>_>
  *__range2;
  Timer_event_loop *this_local;
  
  __end2 = std::
           set<cppurses::Widget_*,_std::less<cppurses::Widget_*>,_std::allocator<cppurses::Widget_*>_>
           ::begin(&this->registered_widgets_);
  widg = (Widget *)
         std::
         set<cppurses::Widget_*,_std::less<cppurses::Widget_*>,_std::allocator<cppurses::Widget_*>_>
         ::end(&this->registered_widgets_);
  while (bVar1 = std::operator!=(&__end2,(_Self *)&widg), bVar1) {
    ppWVar2 = std::_Rb_tree_const_iterator<cppurses::Widget_*>::operator*(&__end2);
    System::post_event<cppurses::Timer_event,cppurses::Widget&>(*ppWVar2);
    std::_Rb_tree_const_iterator<cppurses::Widget_*>::operator++(&__end2);
  }
  time_passed.__r = std::chrono::_V2::system_clock::now();
  time_to_sleep.__r =
       (rep)std::chrono::operator-
                      ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&time_passed,&this->last_time_);
  local_50 = std::function<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_()>::operator()
                       (&this->period_func_);
  local_48.__r = (rep)std::chrono::operator-(&local_50,&time_to_sleep);
  local_58 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::zero();
  bVar1 = std::chrono::operator>(&local_48,&local_58);
  if (bVar1) {
    std::this_thread::sleep_for<long,std::ratio<1l,1000000000l>>(&local_48);
  }
  rVar3 = std::chrono::_V2::system_clock::now();
  (this->last_time_).__d.__r = rVar3;
  bVar1 = std::
          set<cppurses::Widget_*,_std::less<cppurses::Widget_*>,_std::allocator<cppurses::Widget_*>_>
          ::empty(&this->registered_widgets_);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

auto Timer_event_loop::loop_function() -> bool
{
    for (Widget* widg : registered_widgets_) {
        System::post_event<Timer_event>(*widg);
    }
    auto now           = std::chrono::high_resolution_clock::now();
    auto time_passed   = now - last_time_;
    auto time_to_sleep = period_func_() - time_passed;
    if (time_to_sleep > Period_t::zero()) {
        std::this_thread::sleep_for(time_to_sleep);
    }
    last_time_ = std::chrono::high_resolution_clock::now();
    return !registered_widgets_.empty();
}